

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O1

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_multiply_target_and_add<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
          (Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,Field_element *val,
          Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
          *column)

{
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
  *this_00;
  ID_index IVar1;
  undefined8 *puVar2;
  Element *e1;
  pointer ppEVar3;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar4;
  uint *puVar5;
  long lVar6;
  _ValueType __value;
  undefined4 *puVar7;
  invalid_argument *this_01;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  pointer ppEVar15;
  iterator __begin0;
  undefined8 *puVar16;
  bool bVar17;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_38;
  
  if (*val == 0) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"A chain column should not be multiplied by 0.")
    ;
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = (vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
             *)(this + 0x10);
  puVar16 = *(undefined8 **)(this + 0x10);
  puVar2 = *(undefined8 **)(this + 0x18);
  if (puVar16 == puVar2) {
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              *)this_00,
             (long)(column->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(column->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppEVar15 = (column->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar15 != ppEVar3) {
      uVar11 = 0;
      do {
        pEVar4 = *ppEVar15;
        IVar1 = pEVar4->rowIndex_;
        puVar7 = (undefined4 *)operator_new(8);
        *puVar7 = 0;
        puVar7[1] = IVar1;
        *(undefined4 **)(*(long *)this_00 + uVar11 * 8) = puVar7;
        **(uint **)(*(long *)this_00 + uVar11 * 8) =
             (pEVar4->super_Entry_field_element_option).element_;
        ppEVar15 = ppEVar15 + 1;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (ppEVar15 != ppEVar3);
    }
    *(int *)(this + 0x28) = (int)((ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10)) >> 3);
    bVar17 = true;
  }
  else {
    uVar8 = 0;
    do {
      e1 = (Element *)*puVar16;
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (*(Zp_field_operators<unsigned_int,_void> **)(this + 0x30),e1,*val);
      if (e1[1] == *(Element *)(this + 4)) {
        uVar9 = *e1;
        uVar12 = **(uint **)(this + 0x30);
        if (uVar12 <= uVar8) {
          uVar8 = uVar8 % uVar12;
        }
        if (uVar12 <= uVar9) {
          uVar9 = uVar9 % uVar12;
        }
        if (CARRY4(uVar8,uVar9)) {
          uVar8 = (uVar8 - uVar12) + uVar9;
        }
        else {
          if (uVar8 + uVar9 < uVar12) {
            uVar12 = 0;
          }
          uVar8 = (uVar8 + uVar9) - uVar12;
        }
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar2);
    ppEVar3 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar15 = (column->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppEVar15 != ppEVar3;
        ppEVar15 = ppEVar15 + 1) {
      pEVar4 = *ppEVar15;
      *(int *)(this + 0x28) = *(int *)(this + 0x28) + 1;
      if (pEVar4->rowIndex_ == *(ID_index *)(this + 4)) {
        uVar9 = (pEVar4->super_Entry_field_element_option).element_;
        uVar12 = **(uint **)(this + 0x30);
        if (uVar12 <= uVar8) {
          uVar8 = uVar8 % uVar12;
        }
        if (uVar12 <= uVar9) {
          uVar9 = uVar9 % uVar12;
        }
        if (CARRY4(uVar8,uVar9)) {
          uVar8 = (uVar8 - uVar12) + uVar9;
        }
        else {
          if (uVar8 + uVar9 < uVar12) {
            uVar12 = 0;
          }
          uVar8 = (uVar8 + uVar9) - uVar12;
        }
      }
      IVar1 = pEVar4->rowIndex_;
      local_38 = (Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                  *)operator_new(8);
      (local_38->super_Entry_field_element_option).element_ = 0;
      local_38->rowIndex_ = IVar1;
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
      ::
      emplace_back<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>
                (this_00,&local_38);
      lVar10 = *(long *)(this + 0x18);
      puVar5 = *(uint **)(lVar10 + -8);
      *puVar5 = (pEVar4->super_Entry_field_element_option).element_;
      lVar6 = *(long *)(this + 0x10);
      lVar13 = lVar10 - lVar6 >> 3;
      lVar10 = lVar13 + -1;
      if (1 < lVar13) {
        uVar9 = puVar5[1];
        do {
          lVar14 = (lVar10 - (lVar10 + -1 >> 0x3f)) + -1 >> 1;
          lVar13 = *(long *)(lVar6 + lVar14 * 8);
          if (uVar9 <= *(uint *)(lVar13 + 4)) break;
          *(long *)(lVar6 + lVar10 * 8) = lVar13;
          bVar17 = 2 < lVar10;
          lVar10 = lVar14;
        } while (bVar17);
      }
      *(uint **)(lVar6 + lVar10 * 8) = puVar5;
    }
    if ((ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) <
        (ulong)(uint)(*(int *)(this + 0x28) * 2)) {
      Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      ::_prune((Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *)this);
    }
    bVar17 = uVar8 == 0;
  }
  return bVar17;
}

Assistant:

inline bool Heap_column<Master_matrix>::_multiply_target_and_add(const Field_element& val, const Entry_range& column)
{
  if (val == 0u) {
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      clear();
    }
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      column_[i++]->set_element(entry.get_element());
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(0);

  for (Entry* entry : column_) {
    operators_->multiply_inplace(entry->get_element(), val);
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry->get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry->get_element());
    }
  }

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry.get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry.get_element());
    }
    column_.push_back(entryPool_->construct(entry.get_row_index()));
    column_.back()->set_element(entry.get_element());
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  if constexpr (Master_matrix::Option_list::is_z2)
    return !pivotVal;
  else
    return pivotVal == Field_operators::get_additive_identity();
}